

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transcode_utils.h
# Opt level: O1

KTXTexture2 __thiscall
ktx::transcode<false>
          (ktx *this,KTXTexture2 *texture,OptionsTranscodeTarget<false> *options,Reporter *report)

{
  bool bVar1;
  ktx_uint32_t kVar2;
  int iVar3;
  ktxTexture2 *pkVar4;
  Color *pCVar5;
  byte bVar6;
  uint uVar7;
  ktx_uint32_t kVar8;
  uint uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  KTXTexture2 *pKVar12;
  ktx_uint32_t kVar13;
  bool bVar14;
  string_view swizzle;
  string_view swizzle_00;
  string_view swizzle_01;
  string_view swizzle_02;
  r8image dstImage;
  KTXTexture2 convertedTexture;
  rgba8image srcImage;
  ktx_size_t dstImageOffset;
  ktx_size_t srcImageOffset;
  ImageT<unsigned_char,_3U> local_d0;
  KTXTexture2 local_a8;
  KTXTexture2 *local_a0;
  ulong local_98;
  int local_90;
  ktx_uint32_t local_8c;
  ImageT<unsigned_char,_4U> local_88;
  ulong uStack_60;
  KTXTexture2 *local_50;
  ktxTexture2 *local_48;
  ktx_size_t local_40;
  ktx_size_t local_38;
  
  OptionsTranscodeTarget<false>::validateTextureTranscode(options,texture,report);
  if ((options->transcodeTarget).super__Optional_base<ktx_transcode_fmt_e,_true,_true>._M_payload.
      super__Optional_payload_base<ktx_transcode_fmt_e>._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  local_a0 = texture;
  iVar3 = ktxTexture2_TranscodeBasis
                    (texture->handle_,
                     (options->transcodeTarget).
                     super__Optional_base<ktx_transcode_fmt_e,_true,_true>._M_payload.
                     super__Optional_payload_base<ktx_transcode_fmt_e>._M_payload._M_value,0);
  if (iVar3 != 0) {
    local_88.super_Image._vptr_Image = (_func_int **)ktxErrorString(iVar3);
    Reporter::fatal<char_const(&)[37],char_const*>
              (report,INVALID_FILE,(char (*) [37])"Failed to transcode KTX2 texture: {}",
               (char **)&local_88);
  }
  if (options->transcodeSwizzleComponents == 0) {
    bVar14 = false;
  }
  else {
    if (options->transcodeSwizzleComponents != 4) {
      bVar14 = true;
      bVar1 = true;
      goto LAB_00193d21;
    }
    iVar3 = std::__cxx11::string::compare((char *)&options->transcodeSwizzle);
    bVar14 = iVar3 != 0;
  }
  bVar1 = false;
LAB_00193d21:
  local_a8.handle_ = (ktxTexture2 *)0x0;
  if (bVar1) {
    local_88.freePixels = false;
    local_88._33_7_ = 0;
    uStack_60 = 0;
    local_88.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
    local_88.super_Image.primaries = KHR_DF_PRIMARIES_UNSPECIFIED;
    local_88.pixels = (Color *)0x0;
    local_88.super_Image._vptr_Image = (_func_int **)0x0;
    local_88.super_Image.width = 0;
    local_88.super_Image.height = 0;
    pkVar4 = local_a0->handle_;
    uVar10 = options->transcodeSwizzleComponents;
    if (uVar10 == 3) {
      uVar7 = 0x1d;
      uVar9 = 0x17;
    }
    else if (uVar10 == 2) {
      uVar7 = 0x16;
      uVar9 = 0x10;
    }
    else {
      if (uVar10 != 1) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                      ,0x7d,
                      "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = false]"
                     );
      }
      uVar7 = 0xf;
      uVar9 = 9;
    }
    if (pkVar4->vkFormat == 0x2b) {
      uVar9 = uVar7;
    }
    local_88.super_Image._vptr_Image = (_func_int **)((ulong)uVar9 << 0x20);
    local_88.super_Image.transferFunction = pkVar4->baseWidth;
    local_88.super_Image.primaries = pkVar4->baseHeight;
    local_88.pixels = *(Color **)&pkVar4->baseDepth;
    local_88._32_4_ = pkVar4->numLevels;
    local_88._36_4_ = pkVar4->numLayers;
    uStack_60 = (ulong)CONCAT24(CONCAT11(pkVar4->generateMipmaps,pkVar4->isArray),pkVar4->numFaces);
    local_88.super_Image.width = 0;
    local_88.super_Image.height = 0;
    iVar3 = ktxTexture2_Create(&local_88,1,&local_a8);
    if (iVar3 != 0) {
      local_d0.super_Image._vptr_Image = (_func_int **)ktxErrorString(iVar3);
      Reporter::fatal<char_const(&)[36],char_const*>
                (report,IO_FAILURE,(char (*) [36])"Failed to create output texture: {}",
                 (char **)&local_d0);
    }
  }
  local_50 = &local_a8;
  if (local_a8.handle_ == (ktxTexture2 *)0x0) {
    local_50 = local_a0;
  }
  local_48 = (ktxTexture2 *)this;
  if (((bool)(bVar14 | bVar1)) && (pkVar4 = local_a0->handle_, pkVar4->numLevels != 0)) {
    kVar8 = 0;
    pKVar12 = local_a0;
    do {
      bVar6 = (byte)kVar8;
      uVar9 = pkVar4->baseWidth >> (bVar6 & 0x1f);
      uVar10 = uVar9 + (uVar9 == 0);
      uVar9 = pkVar4->baseHeight >> (bVar6 & 0x1f);
      uVar11 = uVar9 + (uVar9 == 0);
      uVar9 = pkVar4->baseDepth >> (bVar6 & 0x1f);
      local_90 = uVar9 + (uVar9 == 0);
      if (pKVar12->handle_->numFaces != 0) {
        local_98 = 0;
        do {
          if (pKVar12->handle_->numLayers != 0) {
            uVar9 = 0;
            do {
              local_8c = uVar9;
              iVar3 = 0;
              do {
                kVar2 = local_8c;
                kVar13 = (int)local_98 + iVar3;
                (*local_a0->handle_->vtbl->GetImageOffset)
                          ((ktxTexture *)local_a0->handle_,kVar8,local_8c,kVar13,&local_38);
                pKVar12 = local_50;
                (*local_50->handle_->vtbl->GetImageOffset)
                          ((ktxTexture *)local_50->handle_,kVar8,kVar2,kVar13,&local_40);
                local_88.pixels = (Color *)(local_a0->handle_->pData + local_38);
                pCVar5 = (Color *)(pKVar12->handle_->pData + local_40);
                local_88.super_Image.height = uVar11;
                local_88.super_Image.width = uVar10;
                local_88.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
                local_88.super_Image.primaries = KHR_DF_PRIMARIES_BT709;
                local_88.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_0025f6e8;
                local_88._32_8_ = local_88._32_8_ & 0xffffffffffffff00;
                switch(options->transcodeSwizzleComponents) {
                case 1:
                  local_d0.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
                  local_d0.super_Image.primaries = KHR_DF_PRIMARIES_BT709;
                  local_d0.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_00260448;
                  local_d0.freePixels = false;
                  swizzle_00._M_str = (options->transcodeSwizzle)._M_dataplus._M_p;
                  swizzle_00._M_len = (options->transcodeSwizzle)._M_string_length;
                  local_d0.super_Image.width = uVar10;
                  local_d0.super_Image.height = uVar11;
                  local_d0.pixels = (Color *)pCVar5;
                  ImageT<unsigned_char,4u>::copyTo<ImageT<unsigned_char,1u>>
                            ((ImageT<unsigned_char,4u> *)&local_88,
                             (ImageT<unsigned_char,_1U> *)&local_d0,swizzle_00);
                  local_d0.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_00260448;
                  break;
                case 2:
                  local_d0.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
                  local_d0.super_Image.primaries = KHR_DF_PRIMARIES_BT709;
                  local_d0.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_00260540;
                  local_d0.freePixels = false;
                  swizzle_02._M_str = (options->transcodeSwizzle)._M_dataplus._M_p;
                  swizzle_02._M_len = (options->transcodeSwizzle)._M_string_length;
                  local_d0.super_Image.width = uVar10;
                  local_d0.super_Image.height = uVar11;
                  local_d0.pixels = (Color *)pCVar5;
                  ImageT<unsigned_char,4u>::copyTo<ImageT<unsigned_char,2u>>
                            ((ImageT<unsigned_char,4u> *)&local_88,
                             (ImageT<unsigned_char,_2U> *)&local_d0,swizzle_02);
                  local_d0.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_00260540;
                  if (local_d0.freePixels != true) goto LAB_0019404e;
                  goto LAB_0019401c;
                case 3:
                  local_d0.super_Image.transferFunction = KHR_DF_TRANSFER_UNSPECIFIED;
                  local_d0.super_Image.primaries = KHR_DF_PRIMARIES_BT709;
                  local_d0.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_00260638;
                  local_d0.freePixels = false;
                  swizzle_01._M_str = (options->transcodeSwizzle)._M_dataplus._M_p;
                  swizzle_01._M_len = (options->transcodeSwizzle)._M_string_length;
                  local_d0.super_Image.width = uVar10;
                  local_d0.super_Image.height = uVar11;
                  local_d0.pixels = (Color *)pCVar5;
                  ImageT<unsigned_char,4u>::copyTo<ImageT<unsigned_char,3u>>
                            ((ImageT<unsigned_char,4u> *)&local_88,&local_d0,swizzle_01);
                  local_d0.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_00260638;
                  break;
                case 4:
                  if (local_88.pixels != pCVar5) {
                    __assert_fail("srcImageData == dstImageData",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                                  ,0xb6,
                                  "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = false]"
                                 );
                  }
                  swizzle._M_str = (options->transcodeSwizzle)._M_dataplus._M_p;
                  swizzle._M_len = (options->transcodeSwizzle)._M_string_length;
                  ImageT<unsigned_char,_4U>::swizzle(&local_88,swizzle);
                  goto LAB_0019404e;
                default:
                  __assert_fail("false",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/transcode_utils.h"
                                ,0xbb,
                                "KTXTexture2 ktx::transcode(KTXTexture2 &&, OptionsTranscodeTarget<TRANSCODE_CMD> &, Reporter &) [TRANSCODE_CMD = false]"
                               );
                }
                if (local_d0.freePixels == true) {
LAB_0019401c:
                  free(local_d0.pixels);
                }
LAB_0019404e:
                local_88.super_Image._vptr_Image = (_func_int **)&PTR__ImageT_0025f6e8;
                if (local_88.freePixels == true) {
                  free(local_88.pixels);
                }
                iVar3 = iVar3 + 1;
              } while (local_90 != iVar3);
              pKVar12 = local_a0;
              uVar9 = local_8c + 1;
            } while (local_8c + 1 < local_a0->handle_->numLayers);
          }
          uVar9 = (int)local_98 + 1;
          local_98 = (ulong)uVar9;
        } while (uVar9 < pKVar12->handle_->numFaces);
      }
      kVar8 = kVar8 + 1;
      pkVar4 = pKVar12->handle_;
    } while (kVar8 < pkVar4->numLevels);
  }
  pkVar4 = local_48;
  *(ktxTexture2 **)local_48 = local_50->handle_;
  local_50->handle_ = (ktxTexture2 *)0x0;
  if (local_a8.handle_ != (ktxTexture2 *)0x0) {
    (*(local_a8.handle_)->vtbl->Destroy)((ktxTexture *)local_a8.handle_);
  }
  return (KTXTexture2)pkVar4;
}

Assistant:

KTXTexture2 transcode(KTXTexture2&& texture, OptionsTranscodeTarget<TRANSCODE_CMD>& options, Reporter& report) {
    options.validateTextureTranscode(texture, report);

    auto ret = ktxTexture2_TranscodeBasis(texture, options.transcodeTarget.value(), 0);
    if (ret != KTX_SUCCESS)
        report.fatal(rc::INVALID_FILE, "Failed to transcode KTX2 texture: {}", ktxErrorString(ret));

    // Need to perform format conversion and swizzling if needed
    bool needFormatConversion = false;
    bool needSwizzle = false;
    if (options.transcodeSwizzleComponents != 0) {
        if (options.transcodeSwizzleComponents == 4) {
            if (options.transcodeSwizzle != "rgba") {
                needSwizzle = true;
            }
        } else {
            needFormatConversion = true;
            needSwizzle = true;
        }
    }

    KTXTexture2 convertedTexture{nullptr};
    if (needFormatConversion) {
        ktxTextureCreateInfo createInfo;
        std::memset(&createInfo, 0, sizeof(createInfo));

        const bool srgb = (texture->vkFormat == VK_FORMAT_R8G8B8A8_SRGB);
        switch (options.transcodeSwizzleComponents) {
        case 1:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8_SRGB : VK_FORMAT_R8_UNORM;
            break;
        case 2:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8G8_SRGB : VK_FORMAT_R8G8_UNORM;
            break;
        case 3:
            createInfo.vkFormat = srgb ? VK_FORMAT_R8G8B8_SRGB : VK_FORMAT_R8G8B8_UNORM;
            break;
        default:
            assert(false);
        }

        createInfo.baseWidth = texture->baseWidth;
        createInfo.baseHeight = texture->baseHeight;
        createInfo.baseDepth = texture->baseDepth;
        createInfo.generateMipmaps = texture->generateMipmaps;
        createInfo.isArray = texture->isArray;
        createInfo.numDimensions = texture->numDimensions;
        createInfo.numFaces = texture->numFaces;
        createInfo.numLayers = texture->numLayers;
        createInfo.numLevels = texture->numLevels;
        createInfo.pDfd = nullptr;

        ret = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE, convertedTexture.pHandle());
        if (KTX_SUCCESS != ret)
            report.fatal(rc::IO_FAILURE, "Failed to create output texture: {}", ktxErrorString(ret));
    }

    KTXTexture2& outputTexture = (convertedTexture.handle() != nullptr) ? convertedTexture : texture;
    if (needFormatConversion || needSwizzle) {
        for (uint32_t levelIndex = 0; levelIndex < texture->numLevels; ++levelIndex) {
            const auto imageWidth = std::max(1u, texture->baseWidth >> levelIndex);
            const auto imageHeight = std::max(1u, texture->baseHeight >> levelIndex);
            const auto imageDepth = std::max(1u, texture->baseDepth >> levelIndex);

            for (uint32_t faceIndex = 0; faceIndex < texture->numFaces; ++faceIndex) {
                for (uint32_t layerIndex = 0; layerIndex < texture->numLayers; ++layerIndex) {
                    for (uint32_t depthIndex = 0; depthIndex < imageDepth; ++depthIndex) {
                        ktx_size_t srcImageOffset;
                        ktxTexture_GetImageOffset(texture, levelIndex, layerIndex, faceIndex + depthIndex, &srcImageOffset);
                        ktx_size_t dstImageOffset;
                        ktxTexture_GetImageOffset(outputTexture, levelIndex, layerIndex, faceIndex + depthIndex, &dstImageOffset);

                        auto srcImageData = texture->pData + srcImageOffset;
                        auto dstImageData = outputTexture->pData + dstImageOffset;

                        rgba8image srcImage(imageWidth, imageHeight, reinterpret_cast<rgba8color*>(srcImageData));

                        switch (options.transcodeSwizzleComponents) {
                        case 1: {
                            r8image dstImage(imageWidth, imageHeight, reinterpret_cast<r8color*>(dstImageData));
                            srcImage.copyToR(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 2: {
                            rg8image dstImage(imageWidth, imageHeight, reinterpret_cast<rg8color*>(dstImageData));
                            srcImage.copyToRG(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 3: {
                            rgb8image dstImage(imageWidth, imageHeight, reinterpret_cast<rgb8color*>(dstImageData));
                            srcImage.copyToRGB(dstImage, options.transcodeSwizzle);
                            break;
                        }
                        case 4: {
                            // Swizzle in-place
                            assert(srcImageData == dstImageData);
                            srcImage.swizzle(options.transcodeSwizzle);
                            break;
                        }
                        default:
                            assert(false);
                        }
                    }
                }
            }
        }
    }

    return std::move(outputTexture);
}